

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.h
# Opt level: O0

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::
WriteSparseArrayIndexProperties<Js::ES5ArrayIndexStaticEnumerator<false>,Js::SerializationCloner<Js::StreamWriter>::JavascriptArrayItemAccessor>
          (SerializationCloner<Js::StreamWriter> *this,ArrayType *arr)

{
  bool bVar1;
  uint32 index;
  BOOL BVar2;
  Engine *this_00;
  void *pvStack_50;
  uint32 i;
  Var value;
  ES5ArrayIndexStaticEnumerator<false> e;
  ScriptContext *scriptContext;
  ArrayType *arr_local;
  SerializationCloner<Js::StreamWriter> *this_local;
  
  e.m_descriptorValidationToken = ScriptContextHolder::GetScriptContext((ScriptContextHolder *)this)
  ;
  ES5ArrayIndexStaticEnumerator<false>::ES5ArrayIndexStaticEnumerator
            ((ES5ArrayIndexStaticEnumerator<false> *)&value,arr);
  pvStack_50 = (void *)0x0;
  while (bVar1 = ES5ArrayIndexStaticEnumerator<false>::MoveNext
                           ((ES5ArrayIndexStaticEnumerator<false> *)&value,(PropertyAttributes *)0x0
                           ), bVar1) {
    index = ES5ArrayIndexStaticEnumerator<false>::GetIndex
                      ((ES5ArrayIndexStaticEnumerator<false> *)&value);
    BVar2 = JavascriptArrayItemAccessor::GetItem
                      (&arr->super_JavascriptArray,index,&stack0xffffffffffffffb0,
                       (ScriptContext *)e.m_descriptorValidationToken);
    if (BVar2 != 0) {
      Write(this,index);
      this_00 = ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                ::GetEngine(&this->
                             super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                           );
      SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::Clone
                (this_00,pvStack_50);
    }
  }
  Write(this,0xffffffff);
  return;
}

Assistant:

void WriteSparseArrayIndexProperties(typename IndexEnumerator::ArrayType* arr)
        {
            ScriptContext* scriptContext = this->GetScriptContext();
            IndexEnumerator e(arr);
            Var value = nullptr;

            while (e.MoveNext())
            {
                uint32 i = e.GetIndex();
                if (ArrayItemAccessor::GetItem(arr, i, &value, scriptContext))
                {
                    Write(i);
                    this->GetEngine()->Clone(value);
                }
            }

            Write(static_cast<uint32>(SCA_PROPERTY_TERMINATOR));
        }